

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

bool __thiscall
testing::internal::
CartesianProductGenerator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_double_(*)(const_unsigned_char_*,_int,_int,_int,_int),_int,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  bool bVar1;
  
  bVar1 = ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>::operator==
                    (&(this->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                      .
                      super__Head_base<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_false>
                      ._M_head_impl,
                     &(this->end_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                      .
                      super__Head_base<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_false>
                      ._M_head_impl);
  if (!bVar1) {
    bVar1 = ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>::operator==
                      (&(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                        .
                        super__Head_base<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_false>
                        ._M_head_impl,
                       &(this->end_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                        .
                        super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                        .
                        super__Head_base<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_false>
                        ._M_head_impl);
    if (!bVar1) {
      bVar1 = ParamIterator<int>::operator==
                        (&(this->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                          .
                          super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                          .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>.
                          _M_head_impl,
                         &(this->end_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<double_(*)(const_unsigned_char_*,_int,_int,_int,_int)>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                          .
                          super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                          .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>.
                          _M_head_impl);
      if (!bVar1) {
        bVar1 = ParamIterator<int>::operator==
                          ((ParamIterator<int> *)&this->current_,(ParamIterator<int> *)&this->end_);
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }